

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::node_output_simple
               (xml_buffered_writer *writer,xml_node_struct *node,uint flags)

{
  uint *__n;
  size_t sVar1;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *__buf_01;
  uint *in_RSI;
  xml_buffered_writer *in_RDI;
  char_t *default_name;
  char_t *in_stack_ffffffffffffff88;
  xml_buffered_writer *in_stack_ffffffffffffff90;
  char_t *in_stack_ffffffffffffff98;
  char *s;
  xml_buffered_writer *in_stack_ffffffffffffffa0;
  xml_buffered_writer *writer_00;
  undefined8 in_stack_ffffffffffffffb0;
  char_t *in_stack_ffffffffffffffb8;
  xml_buffered_writer *in_stack_ffffffffffffffc0;
  xml_node_struct *in_stack_ffffffffffffffc8;
  xml_buffered_writer *in_stack_ffffffffffffffd0;
  
  __n = &switchD_0013640e::switchdataD_0014b030;
  switch(*in_RSI & 0xf) {
  case 3:
    text_output(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0,0x13645c);
    break;
  case 4:
    text_output_cdata(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 5:
    node_output_comment(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 6:
    xml_buffered_writer::write(in_RDI,0x3c,(void *)0x3f,0x14b030);
    if (*(long *)(in_RSI + 2) == 0) {
      s = ":anonymous";
    }
    else {
      s = *(char **)(in_RSI + 2);
    }
    writer_00 = in_RDI;
    xml_buffered_writer::write_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (*(long *)(in_RSI + 4) != 0) {
      xml_buffered_writer::write(in_RDI,0x20,__buf,(size_t)__n);
      node_output_pi_value(writer_00,s);
    }
    xml_buffered_writer::write(in_RDI,0x3f,(void *)0x3e,(size_t)__n);
    break;
  case 7:
    xml_buffered_writer::write(in_RDI,0x3c,(void *)0x3f,0x14b030);
    xml_buffered_writer::write_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    sVar1 = 0;
    node_output_attributes
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0->buffer
               ,(size_t)in_stack_ffffffffffffffb8,(uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               (uint)in_stack_ffffffffffffffb0);
    xml_buffered_writer::write(in_RDI,0x3f,(void *)0x3e,sVar1);
    break;
  case 8:
    xml_buffered_writer::write(in_RDI,0x3c,(void *)0x21,0x44);
    sVar1 = 0x50;
    xml_buffered_writer::write(in_RDI,0x54,(void *)0x59,0x50);
    __buf_01 = __buf_00;
    if (*(long *)(in_RSI + 4) != 0) {
      xml_buffered_writer::write(in_RDI,0x20,__buf_00,sVar1);
      xml_buffered_writer::write_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      __buf_01 = extraout_RDX;
    }
    xml_buffered_writer::write(in_RDI,0x3e,__buf_01,sVar1);
  }
  return;
}

Assistant:

PUGI__FN void node_output_simple(xml_buffered_writer& writer, xml_node_struct* node, unsigned int flags)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		switch (PUGI__NODETYPE(node))
		{
			case node_pcdata:
				text_output(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""), ctx_special_pcdata, flags);
				break;

			case node_cdata:
				text_output_cdata(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_comment:
				node_output_comment(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_pi:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);

				if (node->value)
				{
					writer.write(' ');
					node_output_pi_value(writer, node->value);
				}

				writer.write('?', '>');
				break;

			case node_declaration:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);
				node_output_attributes(writer, node, PUGIXML_TEXT(""), 0, flags | format_raw, 0);
				writer.write('?', '>');
				break;

			case node_doctype:
				writer.write('<', '!', 'D', 'O', 'C');
				writer.write('T', 'Y', 'P', 'E');

				if (node->value)
				{
					writer.write(' ');
					writer.write_string(node->value);
				}

				writer.write('>');
				break;

			default:
				assert(false && "Invalid node type"); // unreachable
		}
	}